

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O3

void __thiscall MemoryLeakWarningReporter::fail(MemoryLeakWarningReporter *this,char *fail_string)

{
  UtestShell *this_00;
  char *fileName;
  size_t lineNumber;
  TestTerminatorWithoutExceptions local_b0;
  SimpleString local_a8;
  undefined1 local_98 [120];
  
  this_00 = UtestShell::getCurrent();
  UtestShell::getName((UtestShell *)local_98);
  fileName = SimpleString::asCharString((SimpleString *)local_98);
  lineNumber = UtestShell::getLineNumber(this_00);
  SimpleString::SimpleString(&local_a8,fail_string);
  FailFailure::FailFailure((FailFailure *)(local_98 + 0x10),this_00,fileName,lineNumber,&local_a8);
  local_b0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)&PTR_exitCurrentTest_00165ac8
  ;
  (*this_00->_vptr_UtestShell[0x27])(this_00,local_98 + 0x10);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_b0);
  TestFailure::~TestFailure((TestFailure *)(local_98 + 0x10));
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString((SimpleString *)local_98);
  return;
}

Assistant:

virtual void fail(char* fail_string) _override
    {
        UtestShell* currentTest = UtestShell::getCurrent();
        currentTest->failWith(FailFailure(currentTest, currentTest->getName().asCharString(), currentTest->getLineNumber(), fail_string), TestTerminatorWithoutExceptions());
    }